

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O0

int MPIABI_Alltoallw(void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Datatype *sendtypes,
                    void *recvbuf,int *recvcounts,int *rdispls,MPIABI_Datatype *recvtypes,
                    MPIABI_Comm comm)

{
  int iVar1;
  ompi_communicator_t *poVar2;
  WPI_Handle<ompi_communicator_t_*> local_40;
  int *local_38;
  int *recvcounts_local;
  void *recvbuf_local;
  MPIABI_Datatype *sendtypes_local;
  int *sdispls_local;
  int *sendcounts_local;
  void *sendbuf_local;
  
  local_38 = recvcounts;
  recvcounts_local = (int *)recvbuf;
  recvbuf_local = sendtypes;
  sendtypes_local = (MPIABI_Datatype *)sdispls;
  sdispls_local = sendcounts;
  sendcounts_local = (int *)sendbuf;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle(&local_40,comm);
  poVar2 = WPI_Handle::operator_cast_to_ompi_communicator_t_((WPI_Handle *)&local_40);
  iVar1 = MPI_Alltoallw(sendbuf,sendcounts,sdispls,sendtypes,recvbuf,recvcounts,rdispls,recvtypes,
                        poVar2);
  return iVar1;
}

Assistant:

int
MPIABI_Alltoallw(const void *sendbuf, const int sendcounts[],
                 const int sdispls[], const MPIABI_Datatype sendtypes[],
                 void *recvbuf, const int recvcounts[], const int rdispls[],
                 const MPIABI_Datatype recvtypes[], MPIABI_Comm comm) {
  if (sizeof(MPI_Datatype) == sizeof(MPIABI_Datatype))
    return MPI_Alltoallw(
        sendbuf, sendcounts, sdispls, (MPI_Datatype *)sendtypes, recvbuf,
        recvcounts, rdispls, (const MPI_Datatype *)recvtypes, (WPI_Comm)comm);
  int comm_size;
  MPI_Comm_size((WPI_Comm)comm, &comm_size);
  std::vector<MPI_Datatype> stypes(comm_size);
  for (int i = 0; i < comm_size; ++i)
    stypes[i] = (WPI_Datatype)sendtypes[i];
  std::vector<MPI_Datatype> rtypes(comm_size);
  for (int i = 0; i < comm_size; ++i)
    rtypes[i] = (WPI_Datatype)recvtypes[i];
  const int ierr =
      MPI_Alltoallw(sendbuf, sendcounts, sdispls, stypes.data(), recvbuf,
                    recvcounts, rdispls, rtypes.data(), (WPI_Comm)comm);
  return ierr;
}